

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ExtractSubrangeInternal
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int start,uint num,long elements)

{
  string *psVar1;
  int i;
  ulong uVar2;
  
  if (0 < (int)num) {
    if (elements != 0) {
      if ((this->super_RepeatedPtrFieldBase).arena_ == (Arena *)0x0) {
        for (uVar2 = 0; num != uVar2; uVar2 = uVar2 + 1) {
          *(void **)(elements + uVar2 * 8) =
               ((this->super_RepeatedPtrFieldBase).rep_)->elements[(long)start + uVar2];
        }
      }
      else {
        for (uVar2 = 0; num != uVar2; uVar2 = uVar2 + 1) {
          psVar1 = internal::StringTypeHandler::New_abi_cxx11_((Arena *)0x0);
          std::__cxx11::string::_M_assign((string *)psVar1);
          *(string **)(elements + uVar2 * 8) = psVar1;
        }
      }
    }
    internal::RepeatedPtrFieldBase::CloseGap(&this->super_RepeatedPtrFieldBase,start,num);
    return;
  }
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::ExtractSubrangeInternal(
    int start, int num, Element** elements, std::true_type) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, size());

  if (num > 0) {
    // Save the values of the removed elements if requested.
    if (elements != NULL) {
      if (GetArenaNoVirtual() != NULL) {
        // If we're on an arena, we perform a copy for each element so that the
        // returned elements are heap-allocated.
        for (int i = 0; i < num; ++i) {
          Element* element =
              RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start);
          typename TypeHandler::Type* new_value =
              TypeHandler::NewFromPrototype(element, NULL);
          TypeHandler::Merge(*element, new_value);
          elements[i] = new_value;
        }
      } else {
        for (int i = 0; i < num; ++i) {
          elements[i] = RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start);
        }
      }
    }
    CloseGap(start, num);
  }
}